

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::FindFileByName
          (SourceTreeDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  MultiFileErrorCollector *pMVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ZeroCopyInputStream *input_00;
  byte local_212;
  undefined1 local_1e0 [8];
  Parser parser;
  Tokenizer tokenizer;
  SingleFileErrorCollector file_error_collector;
  string local_60 [48];
  scoped_ptr<google::protobuf::io::ZeroCopyInputStream> local_30;
  scoped_ptr<google::protobuf::io::ZeroCopyInputStream> input;
  FileDescriptorProto *output_local;
  string *filename_local;
  SourceTreeDescriptorDatabase *this_local;
  
  input.ptr_ = (ZeroCopyInputStream *)output;
  iVar3 = (*this->source_tree_->_vptr_SourceTree[2])(this->source_tree_,filename);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyInputStream>::scoped_ptr
            (&local_30,(ZeroCopyInputStream *)CONCAT44(extraout_var,iVar3));
  bVar2 = internal::scoped_ptr<google::protobuf::io::ZeroCopyInputStream>::operator==
                    (&local_30,(ZeroCopyInputStream *)0x0);
  if (bVar2) {
    if (this->error_collector_ != (MultiFileErrorCollector *)0x0) {
      pMVar1 = this->error_collector_;
      (*this->source_tree_->_vptr_SourceTree[3])(local_60);
      (*pMVar1->_vptr_MultiFileErrorCollector[2])(pMVar1,filename,0xffffffff,0,local_60);
      std::__cxx11::string::~string(local_60);
    }
    this_local._7_1_ = false;
  }
  else {
    SingleFileErrorCollector::SingleFileErrorCollector
              ((SingleFileErrorCollector *)&tokenizer.comment_style_,filename,this->error_collector_
              );
    input_00 = internal::scoped_ptr<google::protobuf::io::ZeroCopyInputStream>::get(&local_30);
    io::Tokenizer::Tokenizer
              ((Tokenizer *)
               &parser.upcoming_detached_comments_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,input_00,
               (ErrorCollector *)&tokenizer.comment_style_);
    Parser::Parser((Parser *)local_1e0);
    if (this->error_collector_ != (MultiFileErrorCollector *)0x0) {
      Parser::RecordErrorsTo((Parser *)local_1e0,(ErrorCollector *)&tokenizer.comment_style_);
    }
    if ((this->using_validation_error_collector_ & 1U) != 0) {
      Parser::RecordSourceLocationsTo((Parser *)local_1e0,&this->source_locations_);
    }
    FileDescriptorProto::set_name((FileDescriptorProto *)input.ptr_,filename);
    bVar2 = Parser::Parse((Parser *)local_1e0,
                          (Tokenizer *)
                          &parser.upcoming_detached_comments_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (FileDescriptorProto *)input.ptr_);
    local_212 = 0;
    if (bVar2) {
      bVar2 = SingleFileErrorCollector::had_errors
                        ((SingleFileErrorCollector *)&tokenizer.comment_style_);
      local_212 = bVar2 ^ 0xff;
    }
    this_local._7_1_ = (bool)(local_212 & 1);
    Parser::~Parser((Parser *)local_1e0);
    io::Tokenizer::~Tokenizer
              ((Tokenizer *)
               &parser.upcoming_detached_comments_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SingleFileErrorCollector::~SingleFileErrorCollector
              ((SingleFileErrorCollector *)&tokenizer.comment_style_);
  }
  internal::scoped_ptr<google::protobuf::io::ZeroCopyInputStream>::~scoped_ptr(&local_30);
  return this_local._7_1_;
}

Assistant:

bool SourceTreeDescriptorDatabase::FindFileByName(
    const string& filename, FileDescriptorProto* output) {
  google::protobuf::scoped_ptr<io::ZeroCopyInputStream> input(source_tree_->Open(filename));
  if (input == NULL) {
    if (error_collector_ != NULL) {
      error_collector_->AddError(filename, -1, 0,
                                 source_tree_->GetLastErrorMessage());
    }
    return false;
  }

  // Set up the tokenizer and parser.
  SingleFileErrorCollector file_error_collector(filename, error_collector_);
  io::Tokenizer tokenizer(input.get(), &file_error_collector);

  Parser parser;
  if (error_collector_ != NULL) {
    parser.RecordErrorsTo(&file_error_collector);
  }
  if (using_validation_error_collector_) {
    parser.RecordSourceLocationsTo(&source_locations_);
  }

  // Parse it.
  output->set_name(filename);
  return parser.Parse(&tokenizer, output) &&
         !file_error_collector.had_errors();
}